

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::InsertCompileDefinition(cmTarget *this,cmValueWithOrigin *entry)

{
  pointer *pppTVar1;
  cmTargetInternals *pcVar2;
  iterator __position;
  cmGeneratorExpression cVar3;
  cmCompiledGeneratorExpression *x;
  TargetPropertyEntry *pTVar4;
  cmGeneratorExpression ge;
  cmGeneratorExpression local_38;
  cmGeneratorExpression local_30;
  auto_ptr<cmCompiledGeneratorExpression> local_28;
  TargetPropertyEntry *local_20;
  
  cmGeneratorExpression::cmGeneratorExpression(&local_30,&entry->Backtrace);
  pcVar2 = (this->Internal).Pointer;
  pTVar4 = (TargetPropertyEntry *)operator_new(0x10);
  cmGeneratorExpression::Parse(&local_38,(string *)&local_30);
  cVar3.Backtrace = local_38.Backtrace;
  local_38.Backtrace = (cmListFileBacktrace *)0x0;
  local_28.x_ = (cmCompiledGeneratorExpression *)0x0;
  (pTVar4->ge).x_ = (cmCompiledGeneratorExpression *)cVar3.Backtrace;
  pTVar4->LinkImplItem = &cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
  __position._M_current =
       (pcVar2->CompileDefinitionsEntries).
       super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_20 = pTVar4;
  if (__position._M_current ==
      (pcVar2->CompileDefinitionsEntries).
      super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
    ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
              ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                *)&pcVar2->CompileDefinitionsEntries,__position,&local_20);
  }
  else {
    *__position._M_current = pTVar4;
    pppTVar1 = &(pcVar2->CompileDefinitionsEntries).
                super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_28);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_38);
  cmGeneratorExpression::~cmGeneratorExpression(&local_30);
  return;
}

Assistant:

void cmTarget::InsertCompileDefinition(const cmValueWithOrigin &entry)
{
  cmGeneratorExpression ge(&entry.Backtrace);

  this->Internal->CompileDefinitionsEntries.push_back(
      new cmTargetInternals::TargetPropertyEntry(ge.Parse(entry.Value)));
}